

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::blockStageIoCheck(TParseContext *this,TSourceLoc *loc,TQualifier *qualifier)

{
  bool bVar1;
  char *pcVar2;
  undefined4 uStack_38;
  undefined4 uStack_34;
  char *extsrt [2];
  TQualifier *qualifier_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  uStack_38 = 0xe81be0;
  uStack_34 = 0;
  extsrt[0]._0_4_ = 0xe810ac;
  extsrt[0]._4_4_ = 0;
  switch(*(uint *)&qualifier->field_0x8 & 0x7f) {
  case 3:
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x96,"GL_ARB_separate_shader_objects","input block");
    TParseVersions::requireStage
              ((TParseVersions *)this,loc,
               EShLangMeshMask|EShLangFragmentMask|EShLangGeometryMask|EShLangTessEvaluationMask|
               EShLangTessControlMask,"input block");
    if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) {
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,8,0x140,2,(char **)AEP_shader_io_blocks,
                 "fragment input block");
    }
    else if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh) &&
            (bVar1 = TQualifier::isTaskMemory(qualifier), !bVar1)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"input blocks cannot be used in a mesh shader","out","");
    }
    break;
  case 4:
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x96,"GL_ARB_separate_shader_objects","output block");
    TParseVersions::requireStage
              ((TParseVersions *)this,loc,
               EShLangMeshMask|EShLangTaskMask|EShLangGeometryMask|EShLangTessEvaluationMask|
               EShLangTessControlMask|EShLangVertexMask,"output block");
    if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangVertex) &&
       (((this->super_TParseContextBase).parsingBuiltins & 1U) == 0)) {
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,8,0x140,2,(char **)AEP_shader_io_blocks,
                 "vertex output block");
    }
    else if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh) &&
            (bVar1 = TQualifier::isTaskMemory(qualifier), bVar1)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only use on input blocks in mesh shader","taskNV","");
    }
    else if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangTask) &&
            (bVar1 = TQualifier::isTaskMemory(qualifier), !bVar1)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"output blocks cannot be used in a task shader","out","");
    }
    break;
  case 5:
    TParseVersions::profileRequires((TParseVersions *)this,loc,8,300,(char *)0x0,"uniform block");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,1,0x8c,"GL_ARB_uniform_buffer_object","uniform block");
    if ((((this->currentBlockQualifier).field_0x10 & 0xf) == 3) &&
       (bVar1 = TQualifier::isPushConstant(&this->currentBlockQualifier), !bVar1)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_EXT_scalar_block_layout,
                 "std430 requires the buffer storage qualifier");
    }
    break;
  case 6:
    TParseVersions::requireProfile((TParseVersions *)this,loc,0xe,"buffer block");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,6,0x1ae,"GL_ARB_shader_storage_buffer_object",
               "buffer block");
    TParseVersions::profileRequires((TParseVersions *)this,loc,8,0x136,(char *)0x0,"buffer block");
    break;
  case 7:
    if (((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv != 0) &&
       ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv < 0x10400)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"shared block requires at least SPIR-V 1.4","shared block","");
    }
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,0xe,0,"GL_EXT_shared_memory_block","shared block");
    break;
  default:
    pcVar2 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       (this->blockName);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"only uniform, buffer, in, or out blocks are supported",pcVar2,"");
    break;
  case 9:
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x1cc,2,(char **)&uStack_38,"rayPayloadNV block");
    TParseVersions::requireStage
              ((TParseVersions *)this,loc,
               EShLangMissMask|EShLangClosestHitMask|EShLangAnyHitMask|EShLangRayGenMask,
               "rayPayloadNV block");
    break;
  case 10:
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x1cc,2,(char **)&uStack_38,"rayPayloadInNV block");
    TParseVersions::requireStage
              ((TParseVersions *)this,loc,EShLangMissMask|EShLangClosestHitMask|EShLangAnyHitMask,
               "rayPayloadInNV block");
    break;
  case 0xb:
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x1cc,2,(char **)&uStack_38,"hitAttributeNV block");
    TParseVersions::requireStage
              ((TParseVersions *)this,loc,
               EShLangClosestHitMask|EShLangAnyHitMask|EShLangIntersectMask,"hitAttributeNV block");
    break;
  case 0xc:
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x1cc,2,(char **)&uStack_38,"callableDataNV block");
    TParseVersions::requireStage
              ((TParseVersions *)this,loc,
               EShLangCallableMask|EShLangMissMask|EShLangClosestHitMask|EShLangRayGenMask,
               "callableDataNV block");
    break;
  case 0xd:
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x1cc,2,(char **)&uStack_38,"callableDataInNV block");
    TParseVersions::requireStage
              ((TParseVersions *)this,loc,EShLangCallableMask,"callableDataInNV block");
    break;
  case 0xe:
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x1cc,"GL_NV_shader_invocation_reorder",
               "hitObjectAttributeNV block");
    TParseVersions::requireStage
              ((TParseVersions *)this,loc,EShLangMissMask|EShLangClosestHitMask|EShLangRayGenMask,
               "hitObjectAttributeNV block");
  }
  return;
}

Assistant:

void TParseContext::blockStageIoCheck(const TSourceLoc& loc, const TQualifier& qualifier)
{
    const char *extsrt[2] = { E_GL_NV_ray_tracing, E_GL_EXT_ray_tracing };
    switch (qualifier.storage) {
    case EvqUniform:
        profileRequires(loc, EEsProfile, 300, nullptr, "uniform block");
        profileRequires(loc, ENoProfile, 140, E_GL_ARB_uniform_buffer_object, "uniform block");
        if (currentBlockQualifier.layoutPacking == ElpStd430 && ! currentBlockQualifier.isPushConstant())
            requireExtensions(loc, 1, &E_GL_EXT_scalar_block_layout, "std430 requires the buffer storage qualifier");
        break;
    case EvqBuffer:
        requireProfile(loc, EEsProfile | ECoreProfile | ECompatibilityProfile, "buffer block");
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 430, E_GL_ARB_shader_storage_buffer_object, "buffer block");
        profileRequires(loc, EEsProfile, 310, nullptr, "buffer block");
        break;
    case EvqVaryingIn:
        profileRequires(loc, ~EEsProfile, 150, E_GL_ARB_separate_shader_objects, "input block");
        // It is a compile-time error to have an input block in a vertex shader or an output block in a fragment shader
        // "Compute shaders do not permit user-defined input variables..."
        requireStage(loc, (EShLanguageMask)(EShLangTessControlMask|EShLangTessEvaluationMask|EShLangGeometryMask|
            EShLangFragmentMask|EShLangMeshMask), "input block");
        if (language == EShLangFragment) {
            profileRequires(loc, EEsProfile, 320, Num_AEP_shader_io_blocks, AEP_shader_io_blocks, "fragment input block");
        } else if (language == EShLangMesh && ! qualifier.isTaskMemory()) {
            error(loc, "input blocks cannot be used in a mesh shader", "out", "");
        }
        break;
    case EvqVaryingOut:
        profileRequires(loc, ~EEsProfile, 150, E_GL_ARB_separate_shader_objects, "output block");
        requireStage(loc, (EShLanguageMask)(EShLangVertexMask|EShLangTessControlMask|EShLangTessEvaluationMask|
            EShLangGeometryMask|EShLangMeshMask|EShLangTaskMask), "output block");
        // ES 310 can have a block before shader_io is turned on, so skip this test for built-ins
        if (language == EShLangVertex && ! parsingBuiltins) {
            profileRequires(loc, EEsProfile, 320, Num_AEP_shader_io_blocks, AEP_shader_io_blocks, "vertex output block");
        } else if (language == EShLangMesh && qualifier.isTaskMemory()) {
            error(loc, "can only use on input blocks in mesh shader", "taskNV", "");
        } else if (language == EShLangTask && ! qualifier.isTaskMemory()) {
            error(loc, "output blocks cannot be used in a task shader", "out", "");
        }
        break;
    case EvqShared:
        if (spvVersion.spv > 0 && spvVersion.spv < EShTargetSpv_1_4) {
            error(loc, "shared block requires at least SPIR-V 1.4", "shared block", "");
        }
        profileRequires(loc, EEsProfile | ECoreProfile | ECompatibilityProfile, 0, E_GL_EXT_shared_memory_block, "shared block");
        break;
    case EvqPayload:
        profileRequires(loc, ~EEsProfile, 460, 2, extsrt, "rayPayloadNV block");
        requireStage(loc, (EShLanguageMask)(EShLangRayGenMask | EShLangAnyHitMask | EShLangClosestHitMask | EShLangMissMask),
            "rayPayloadNV block");
        break;
    case EvqPayloadIn:
        profileRequires(loc, ~EEsProfile, 460, 2, extsrt, "rayPayloadInNV block");
        requireStage(loc, (EShLanguageMask)(EShLangAnyHitMask | EShLangClosestHitMask | EShLangMissMask),
            "rayPayloadInNV block");
        break;
    case EvqHitAttr:
        profileRequires(loc, ~EEsProfile, 460, 2, extsrt, "hitAttributeNV block");
        requireStage(loc, (EShLanguageMask)(EShLangIntersectMask | EShLangAnyHitMask | EShLangClosestHitMask), "hitAttributeNV block");
        break;
    case EvqCallableData:
        profileRequires(loc, ~EEsProfile, 460, 2, extsrt, "callableDataNV block");
        requireStage(loc, (EShLanguageMask)(EShLangRayGenMask | EShLangClosestHitMask | EShLangMissMask | EShLangCallableMask),
            "callableDataNV block");
        break;
    case EvqCallableDataIn:
        profileRequires(loc, ~EEsProfile, 460, 2, extsrt, "callableDataInNV block");
        requireStage(loc, (EShLanguageMask)(EShLangCallableMask), "callableDataInNV block");
        break;
    case EvqHitObjectAttrNV:
        profileRequires(loc, ~EEsProfile, 460, E_GL_NV_shader_invocation_reorder, "hitObjectAttributeNV block");
        requireStage(loc, (EShLanguageMask)(EShLangRayGenMask | EShLangClosestHitMask | EShLangMissMask), "hitObjectAttributeNV block");
        break;
    default:
        error(loc, "only uniform, buffer, in, or out blocks are supported", blockName->c_str(), "");
        break;
    }
}